

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_543c74::ForwardTemplateReference::hasRHSComponentSlow
          (ForwardTemplateReference *this,OutputStream *S)

{
  Cache CVar1;
  int iVar2;
  undefined1 uVar3;
  
  if (this->Printing == false) {
    this->Printing = true;
    CVar1 = this->Ref->RHSComponentCache;
    if (CVar1 == Unknown) {
      iVar2 = (**this->Ref->_vptr_Node)();
      uVar3 = (undefined1)iVar2;
    }
    else {
      uVar3 = CVar1 == Yes;
    }
    this->Printing = false;
  }
  else {
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

bool hasRHSComponentSlow(OutputStream &S) const override {
    if (Printing)
      return false;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    return Ref->hasRHSComponent(S);
  }